

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O1

int metacall_register(char *name,_func_void_ptr_size_t_void_ptr_ptr_void_ptr *invoke,void **func,
                     metacall_value_id return_type,size_t size,...)

{
  char in_AL;
  int iVar1;
  void **ppvVar2;
  undefined8 in_R9;
  size_t sVar3;
  void **ppvVar4;
  ulong uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  type_id types [16];
  uint local_118;
  type_id local_f8 [16];
  void *local_b8 [5];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_90 = in_R9;
  if (size != 0) {
    local_118 = 0x28;
    sVar3 = 0;
    ppvVar4 = &va[0].overflow_arg_area;
    do {
      if (local_118 < 0x29) {
        uVar5 = (ulong)local_118;
        local_118 = local_118 + 8;
        ppvVar2 = ppvVar4;
        ppvVar4 = (void **)((long)local_b8 + uVar5);
      }
      else {
        ppvVar2 = ppvVar4 + 1;
      }
      local_f8[sVar3] = *(type_id *)ppvVar4;
      sVar3 = sVar3 + 1;
      ppvVar4 = ppvVar2;
    } while (size != sVar3);
  }
  iVar1 = loader_register(name,(loader_register_invoke)invoke,(function *)func,return_type,size,
                          local_f8);
  return iVar1;
}

Assistant:

int metacall_register(const char *name, void *(*invoke)(size_t, void *[], void *), void **func, enum metacall_value_id return_type, size_t size, ...)
{
	type_id types[METACALL_ARGS_SIZE];

	va_list va;

	va_start(va, size);

	size_t iterator;

	for (iterator = 0; iterator < size; ++iterator)
	{
		types[iterator] = (type_id)va_arg(va, int);
	}

	va_end(va);

	return loader_register(name, (loader_register_invoke)invoke, (function *)func, (type_id)return_type, size, (type_id *)types);
}